

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtx11extras.cpp
# Opt level: O2

quint32 QX11Info::appUserTime(void)

{
  quint32 qVar1;
  QPlatformNativeInterface *pQVar2;
  QScreen *pQVar3;
  long in_FS_OFFSET;
  QArrayDataPointer<char> QStack_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  qVar1 = 0;
  if (QCoreApplication::self != 0) {
    pQVar2 = QGuiApplication::platformNativeInterface();
    if (pQVar2 != (QPlatformNativeInterface *)0x0) {
      pQVar3 = QGuiApplication::primaryScreen();
      QByteArray::QByteArray((QByteArray *)&QStack_38,"appusertime",-1);
      qVar1 = (**(code **)(*(long *)pQVar2 + 0x70))(pQVar2,&QStack_38,pQVar3);
      QArrayDataPointer<char>::~QArrayDataPointer(&QStack_38);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return qVar1;
  }
  __stack_chk_fail();
}

Assistant:

quint32 QX11Info::appUserTime()
{
    if (!qApp)
        return 0;
    QPlatformNativeInterface *native = qApp->platformNativeInterface();
    if (!native)
        return 0;
    QScreen* screen = QGuiApplication::primaryScreen();
    return static_cast<xcb_timestamp_t>(reinterpret_cast<quintptr>(native->nativeResourceForScreen("appusertime", screen)));
}